

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  address *a_1;
  istream *piVar8;
  long lVar9;
  pointer paVar10;
  ostream *poVar11;
  string *a_3;
  string *addr_00;
  pointer pbVar12;
  char cVar13;
  int i;
  address *a_2;
  pointer __x;
  ulong uVar14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrs;
  vector<sfi::data::address,_std::allocator<sfi::data::address>_> counts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrsFin;
  string addr;
  string oct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8 [32];
  string addr_1;
  ifstream stream;
  
  std::ifstream::ifstream(&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  addrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addrsFin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  addrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  counts.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addrsFin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  addrsFin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  counts.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  counts.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    do {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&stream,(string *)&line);
      pbVar3 = addrs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
        for (pbVar12 = addrs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 = addrsFin.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            addr_00 = addrsFin.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::string::string((string *)&a,(string *)pbVar12);
          octets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          octets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          octets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::istringstream::istringstream((istringstream *)&addr_1,(string *)&a,_S_in);
          oct._M_dataplus._M_p = (pointer)&oct.field_2;
          oct._M_string_length = 0;
          oct.field_2._M_local_buf[0] = '\0';
          while (piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&addr_1,(string *)&oct,'.'),
                ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&octets,&oct);
          }
          uVar14 = (long)octets.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)octets.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar14 < 5) {
            if ((uVar14 == 4) || (uVar14 == 1)) {
              std::__cxx11::string::string((string *)&local_498,(string *)&a);
            }
            else {
              std::__cxx11::string::string((string *)&local_498,"0",(allocator *)&addr);
            }
          }
          else {
            std::operator+(&local_458,
                           octets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,".");
            std::operator+(&local_438,&local_458,
                           octets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
            std::operator+(&local_418,&local_438,".");
            std::operator+(&local_3f8,&local_418,
                           octets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
            std::operator+(&addr,&local_3f8,".");
            std::operator+(&local_498,&addr,
                           octets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 3);
            std::__cxx11::string::~string((string *)&addr);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_458);
          }
          std::__cxx11::string::~string((string *)&oct);
          std::__cxx11::istringstream::~istringstream((istringstream *)&addr_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&octets);
          std::__cxx11::string::operator=((string *)&a,(string *)&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          lVar9 = std::__cxx11::string::find((char)&a,0x2e);
          if (lVar9 == -1) {
            iVar7 = sfi::logic::getBase(&a);
            if ((iVar7 == 2) && (a._M_string_length < 0x20)) {
              std::__cxx11::string::insert((ulong)&a,0,' ' - (char)a._M_string_length);
            }
            std::__cxx11::string::string((string *)&local_478,(string *)&a);
            sfi::logic::toDot(&addr_1,&local_478,iVar7);
            std::__cxx11::string::operator=((string *)&a,(string *)&addr_1);
            std::__cxx11::string::~string((string *)&addr_1);
            std::__cxx11::string::~string((string *)&local_478);
            sfi::logic::dotToDotDec(&addr_1,&a,iVar7);
          }
          else {
            iVar7 = sfi::logic::getBase(&a);
            sfi::logic::dotToDotDec(&addr_1,&a,iVar7);
          }
          std::__cxx11::string::operator=((string *)&a,(string *)&addr_1);
          std::__cxx11::string::~string((string *)&addr_1);
          bVar5 = sfi::logic::validateAddr(&a);
          if (bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&addrsFin,&a);
          }
          std::__cxx11::string::~string((string *)&a);
        }
        do {
          if (addr_00 == pbVar4) {
            iVar7 = 0;
            for (paVar10 = counts.
                           super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                paVar10 !=
                counts.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                _M_impl.super__Vector_impl_data._M_finish; paVar10 = paVar10 + 1) {
              if (iVar7 < paVar10->count) {
                iVar7 = paVar10->count;
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&addrs);
            paVar10 = counts.
                      super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (__x = counts.
                       super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                       _M_impl.super__Vector_impl_data._M_start; __x != paVar10; __x = __x + 1) {
              if (__x->count == iVar7) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&addrs,&__x->addr);
              }
            }
            std::
            __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (addrs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       addrs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            pbVar3 = addrs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar12 = addrs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
                pbVar12 = pbVar12 + 1) {
              bVar5 = sfi::logic::validateAddr(pbVar12);
              if (bVar5) {
                poVar11 = std::operator<<((ostream *)&std::cout,(string *)pbVar12);
                std::operator<<(poVar11," ");
              }
            }
            std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::~vector(&counts);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&addrsFin);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&addrs);
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream(&stream);
            return 0;
          }
          bVar5 = sfi::logic::validateAddr(addr_00);
          if (bVar5) {
            lVar15 = 0;
            lVar9 = 0;
            for (uVar14 = 0;
                uVar14 < (ulong)(((long)counts.
                                        super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)counts.
                                       super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x28);
                uVar14 = uVar14 + 1) {
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&((counts.
                                                  super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->addr).
                                                 _M_dataplus._M_p + lVar15),addr_00);
              if (_Var6) {
                counts.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar9 >> 0x20].count =
                     counts.
                     super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9 >> 0x20].count + 1;
                goto LAB_00104b26;
              }
              lVar9 = lVar9 + 0x100000000;
              lVar15 = lVar15 + 0x28;
            }
            std::__cxx11::string::string(local_3d8,(string *)addr_00);
            std::__cxx11::string::string((string *)&addr_1,local_3d8);
            std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::
            emplace_back<sfi::data::address>(&counts,(address *)&addr_1);
            std::__cxx11::string::~string((string *)&addr_1);
            std::__cxx11::string::~string(local_3d8);
          }
LAB_00104b26:
          addr_00 = addr_00 + 1;
        } while( true );
      }
    } while (200 < line._M_string_length - 100);
    std::__cxx11::string::string((string *)&addr,"",(allocator *)&addr_1);
    iVar7 = std::__cxx11::string::find((char *)&line,0x10702e);
    cVar13 = (char)&addr;
    if (iVar7 == -1) {
      for (uVar14 = 0; uVar14 < line._M_string_length; uVar14 = uVar14 + 1) {
        if (line._M_dataplus._M_p[uVar14] == '.' ||
            (byte)(line._M_dataplus._M_p[uVar14] - 0x30U) < 10) {
          std::__cxx11::string::push_back(cVar13);
        }
        else {
          if (3 < CONCAT44(addr._M_string_length._4_4_,(int)addr._M_string_length)) {
            std::__cxx11::string::string((string *)&addr_1,(string *)&addr);
            if (*addr_1._M_dataplus._M_p == '.') {
              std::__cxx11::string::substr((ulong)&oct,(ulong)&addr_1);
              std::__cxx11::string::operator=((string *)&addr_1,(string *)&oct);
              std::__cxx11::string::~string((string *)&oct);
            }
            if (addr_1._M_dataplus._M_p[addr_1._M_string_length - 1] == '.') {
              std::__cxx11::string::substr((ulong)&oct,(ulong)&addr_1);
              std::__cxx11::string::operator=((string *)&addr_1,(string *)&oct);
              std::__cxx11::string::~string((string *)&oct);
            }
            iVar7 = std::__cxx11::string::find((char *)&addr_1,0x107022);
            if (iVar7 == -1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&addrs,&addr_1);
            }
            std::__cxx11::string::~string((string *)&addr_1);
          }
          std::__cxx11::string::assign((char *)&addr);
        }
      }
    }
    else {
      bVar5 = true;
      for (uVar14 = (ulong)iVar7; uVar14 < line._M_string_length; uVar14 = uVar14 + 1) {
        bVar2 = line._M_dataplus._M_p[uVar14];
        if ((char)bVar2 < 'a') {
          if ((char)bVar2 < 'A') {
            if ((char)bVar2 < '0') {
              if (bVar2 == 0x2e) {
                std::__cxx11::string::push_back(cVar13);
                bVar5 = false;
              }
            }
            else if (bVar2 < 0x3a) goto LAB_00104661;
          }
          else if (bVar2 < 0x47) goto LAB_00104661;
        }
        else if (bVar2 == 0x78 || bVar2 < 0x67) {
LAB_00104661:
          std::__cxx11::string::push_back(cVar13);
        }
      }
      if (bVar5) {
        std::__cxx11::string::substr((ulong)&addr_1,(ulong)&addr);
        std::__cxx11::string::operator=((string *)&addr,(string *)&addr_1);
        std::__cxx11::string::~string((string *)&addr_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&addrs,&addr);
      }
      else {
        iVar7 = (int)addr._M_string_length + 5;
        do {
          iVar1 = iVar7 + -6;
          iVar7 = iVar7 + -1;
        } while (addr._M_dataplus._M_p[iVar1] != '.');
        std::__cxx11::string::substr((ulong)&addr_1,(ulong)&addr);
        std::__cxx11::string::operator=((string *)&addr,(string *)&addr_1);
        std::__cxx11::string::~string((string *)&addr_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&addrs,&addr);
      }
    }
    std::__cxx11::string::~string((string *)&addr);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/intruder");
    string line;
    vector<string> addrs;
    vector<string> addrsFin;
    vector<sfi::data::address> counts;
//    int lineNo = 0;
    while (getline(stream, line)) {
//        lineNo+=1;
//        if(lineNo<=1200) {
            if (line.length() >= 100 && line.length() <= 300)
                sfi::logic::searchAddr(line, addrs);
//        } else {
//            return 0;
//        }
    }

    for (auto a : addrs) {
        a = sfi::logic::octetValidation(a);
        if(a.find('.')!=-1){
            a = sfi::logic::dotToDotDec(a,sfi::logic::getBase(a));
        } else {
            int base = sfi::logic::getBase(a);
            if(base == 2 && a.length() < 32) {
                a.insert(0, 32 - a.length(), '0');
            }
            a = sfi::logic::toDot(a,base);
            a = sfi::logic::dotToDotDec(a,base);
        }

        if(sfi::logic::validateAddr(a))
            addrsFin.push_back(a);
    }

    for(const auto& a : addrsFin){
        if(sfi::logic::validateAddr(a)) {
            int el = sfi::logic::elExists(counts, a);
            if (el != -1) {
                counts[el].increaseCount();
            } else {
                counts.push_back(sfi::data::address(a, 1));
            }
        }
    }

    int maxOcc = 0;
    for (const sfi::data::address& a : counts) {
        if(a.count > maxOcc)
            maxOcc = a.count;
    }

    addrs.clear();

    for (const sfi::data::address& a : counts) {
        if(a.count == maxOcc)
            addrs.push_back(a.addr);
    }

    std::sort(addrs.begin(),addrs.end());

    for(const string& a : addrs)
        if(sfi::logic::validateAddr(a))
            cout << a << " ";

    return 0;
}